

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O2

void display_options_item
               (menu_conflict *menu,wchar_t oid,_Bool cursor,wchar_t row,wchar_t col,wchar_t width)

{
  object_kind *poVar1;
  anon_struct_24_3_d8ca22ae *paVar2;
  uint8_t *puVar3;
  long lVar4;
  ulong uVar5;
  
  lVar4 = (long)oid;
  if ((uint)oid < 0xf) {
    uVar5 = 1;
    poVar1 = k_info;
    while ((uVar5 < z_info->k_max &&
           (((poVar1[1].name == (char *)0x0 || (poVar1[1].everseen != true)) ||
            (poVar1[1].tval != sval_dependent[lVar4].tval))))) {
      uVar5 = uVar5 + 1;
      poVar1 = poVar1 + 1;
    }
    puVar3 = curs_attrs[uVar5 < z_info->k_max] + cursor;
    paVar2 = (anon_struct_24_3_d8ca22ae *)(sval_dependent + lVar4);
  }
  else {
    if (2 < lVar4 - 0x10U) {
      return;
    }
    puVar3 = curs_attrs[1] + cursor;
    paVar2 = extra_item_options + (lVar4 - 0x10U);
  }
  c_prt(*puVar3,paVar2->name,row,col);
  return;
}

Assistant:

static void display_options_item(struct menu *menu, int oid, bool cursor,
								 int row, int col, int width)
{
	size_t line = (size_t) oid;

	/* Most of the menu is svals, with a small "extra options" section below */
	if (line < N_ELEMENTS(sval_dependent)) {
		bool known = seen_tval(sval_dependent[line].tval);
		uint8_t attr = curs_attrs[known ? CURS_KNOWN: CURS_UNKNOWN][(int)cursor];

		c_prt(attr, sval_dependent[line].desc, row, col);
	} else {
		uint8_t attr = curs_attrs[CURS_KNOWN][(int)cursor];

		line = line - N_ELEMENTS(sval_dependent) - 1;

		if (line < N_ELEMENTS(extra_item_options))
			c_prt(attr, extra_item_options[line].name, row, col);
	}
}